

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_transcript.cc
# Opt level: O1

bool __thiscall
bssl::SSLTranscript::CopyToHashContext(SSLTranscript *this,EVP_MD_CTX *ctx,EVP_MD *digest)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  EVP_MD *md;
  
  md = (EVP_MD *)EVP_MD_CTX_get0_md(&(this->hash_).ctx_);
  if (md != (EVP_MD *)0x0) {
    iVar2 = EVP_MD_type(md);
    iVar3 = EVP_MD_type((EVP_MD *)digest);
    if (iVar2 == iVar3) {
      iVar2 = EVP_MD_CTX_copy_ex((EVP_MD_CTX *)ctx,(EVP_MD_CTX *)&this->hash_);
      return iVar2 != 0;
    }
  }
  if ((this->buffer_)._M_t.super___uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_buf_mem_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_buf_mem_st_*,_false>._M_head_impl == (buf_mem_st *)0x0) {
    ERR_put_error(0x10,0,0x44,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_transcript.cc"
                  ,0x99);
    return false;
  }
  bVar1 = HashBuffer(this,ctx,digest);
  return bVar1;
}

Assistant:

bool SSLTranscript::CopyToHashContext(EVP_MD_CTX *ctx,
                                      const EVP_MD *digest) const {
  const EVP_MD *transcript_digest = Digest();
  if (transcript_digest != nullptr &&
      EVP_MD_type(transcript_digest) == EVP_MD_type(digest)) {
    return EVP_MD_CTX_copy_ex(ctx, hash_.get());
  }

  if (buffer_) {
    return HashBuffer(ctx, digest);
  }

  OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
  return false;
}